

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

float vec3_distance_squared_point_line_segment(vec3 p,vec3 a,vec3 b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = b.x - a.x;
  fVar3 = p.x - a.x;
  fVar7 = b.y - a.y;
  fVar4 = b.z - a.z;
  fVar5 = p.y - a.y;
  fVar1 = p.z - a.z;
  fVar2 = fVar1 * fVar4 + fVar3 * fVar6 + fVar5 * fVar7;
  if (fVar2 <= 0.0) {
    fVar1 = fVar1 * fVar1 + fVar3 * fVar3 + fVar5 * fVar5;
  }
  else {
    fVar4 = fVar4 * fVar4 + fVar6 * fVar6 + fVar7 * fVar7;
    if (fVar4 <= fVar2) {
      fVar1 = p.x - b.x;
      fVar3 = p.y - b.y;
      fVar2 = p.z - b.z;
      return fVar2 * fVar2 + fVar1 * fVar1 + fVar3 * fVar3;
    }
    fVar1 = (fVar1 * fVar1 + fVar3 * fVar3 + fVar5 * fVar5) - (fVar2 * fVar2) / fVar4;
  }
  return fVar1;
}

Assistant:

float vec3_distance_squared_point_line_segment(vec3 p, vec3 a, vec3 b) {
    vec3 c = p;
    vec3 ab = vec3_sub(b, a);
    vec3 ac = vec3_sub(c, a);
    vec3 bc = vec3_sub(c, b);
    float e = vec3_dot(ac, ab);
    if (e <= 0.0f) return vec3_dot(ac, ac);
    float f = vec3_dot(ab, ab);
    if (e >= f) return vec3_dot(bc, bc);
    return vec3_dot(ac, ac) - e*e/f;
}